

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

int co_cond_broadcast(stCoCond_t *si)

{
  stTimeoutItem_t *ap;
  stCoCondItem_t *psVar1;
  stCoCondItem_t *psVar2;
  stTimeoutItemLink_t *psVar3;
  stTimeoutItem_t *psVar4;
  stTimeoutItemLink_t *psVar5;
  stCoCondItem_t *lp;
  long in_FS_OFFSET;
  
  psVar1 = si->head;
  while (psVar1 != (stCoCondItem_t *)0x0) {
    if (psVar1 == si->tail) {
      si->head = (stCoCondItem_t *)0x0;
      si->tail = (stCoCondItem_t *)0x0;
      psVar1->pPrev = (stCoCondItem_t *)0x0;
      psVar1->pNext = (stCoCondItem_t *)0x0;
      psVar1->pLink = (stCoCond_t *)0x0;
    }
    else {
      psVar2 = psVar1->pNext;
      si->head = psVar2;
      psVar1->pPrev = (stCoCondItem_t *)0x0;
      psVar1->pNext = (stCoCondItem_t *)0x0;
      psVar1->pLink = (stCoCond_t *)0x0;
      if (psVar2 != (stCoCondItem_t *)0x0) {
        psVar2->pPrev = (stCoCondItem_t *)0x0;
      }
    }
    ap = &psVar1->timeout;
    RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(ap);
    if ((psVar1->timeout).pLink == (stTimeoutItemLink_t *)0x0) {
      psVar3 = *(stTimeoutItemLink_t **)(*(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x408) + 0x18);
      psVar4 = psVar3->tail;
      psVar5 = (stTimeoutItemLink_t *)&psVar4->pNext;
      if (psVar4 == (stTimeoutItem_t *)0x0) {
        psVar5 = psVar3;
      }
      psVar5->head = ap;
      psVar3->tail = ap;
      (psVar1->timeout).pPrev = psVar4;
      (psVar1->timeout).pNext = (stTimeoutItem_t *)0x0;
      (psVar1->timeout).pLink = psVar3;
    }
    psVar1 = si->head;
  }
  return 0;
}

Assistant:

stCoCondItem_t *co_cond_pop( stCoCond_t *link )
{
	stCoCondItem_t *p = link->head;
	if( p )
	{
		PopHead<stCoCondItem_t,stCoCond_t>( link );
	}
	return p;
}